

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall amrex::MLEBABecLap::prepareForSolve(MLEBABecLap *this)

{
  pointer puVar1;
  pointer piVar2;
  uint uVar3;
  ulong uVar4;
  pointer paVar5;
  pointer paVar6;
  int alev;
  long lVar7;
  long lVar8;
  Real RVar9;
  Real RVar10;
  value_type_conflict local_34;
  
  MLCellABecLap::prepareForSolve(&this->super_MLCellABecLap);
  averageDownCoeffs(this);
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(((this->m_eb_phi).
          super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          .
          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> !=
      (MultiFab *)0x0) {
    for (uVar4 = (ulong)(uint)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                              m_num_amr_levels; 1 < (int)uVar4; uVar4 = uVar4 - 1) {
      puVar1 = (this->m_eb_phi).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      EB_average_down_boundaries
                ((MultiFab *)
                 puVar1[uVar4 - 1]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 (MultiFab *)
                 puVar1[uVar4 - 2]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,2,0);
    }
  }
  piVar2 = (this->m_is_singular).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_is_singular).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar2) {
    (this->m_is_singular).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar2
    ;
  }
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_is_singular).super_vector<int,_std::allocator<int>_>,
             (long)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels,
             &local_34);
  paVar5 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar5 = (pointer)std::
                    __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                              (paVar5,paVar5 + 1);
  paVar6 = (pointer)std::
                    __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                              ();
  if (((paVar5 == (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_lobc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1) &&
      (paVar6 == (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_hibc.
                 super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                 .
                 super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1)) &&
     ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(((this->m_eb_phi).
          super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          .
          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0)) {
    lVar8 = 2;
    for (lVar7 = 0;
        lVar7 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels;
        lVar7 = lVar7 + 1) {
      if ((this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_domain_covered.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar7] != 0) {
        uVar3 = 1;
        if ((this->m_a_scalar != 0.0) || (NAN(this->m_a_scalar))) {
          RVar9 = MultiFab::sum((MultiFab *)
                                (*(long *)((long)&(((this->m_a_coeffs).
                                                                                                        
                                                  super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                                  ).
                                                  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                          + lVar8 * 4) + -0x180),0,false);
          RVar10 = MultiFab::norm0((MultiFab *)
                                   (*(long *)((long)&(((this->m_a_coeffs).
                                                                                                              
                                                  super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                                  ).
                                                  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                             + lVar8 * 4) + -0x180),0,0,false,false);
          uVar3 = (uint)(RVar9 <= RVar10 * 1e-12);
        }
        (this->m_is_singular).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = uVar3;
      }
      lVar8 = lVar8 + 6;
    }
  }
  this->m_needs_update = false;
  return;
}

Assistant:

void
MLEBABecLap::prepareForSolve ()
{
    BL_PROFILE("MLABecLaplacian::prepareForSolve()");

    MLCellABecLap::prepareForSolve();

    averageDownCoeffs();

    if (m_eb_phi[0]) {
        for (int amrlev = m_num_amr_levels-1; amrlev > 0; --amrlev) {
            amrex::EB_average_down_boundaries(*m_eb_phi[amrlev], *m_eb_phi[amrlev-1],
                                              mg_coarsen_ratio, 0);
        }
    }

    m_is_singular.clear();
    m_is_singular.resize(m_num_amr_levels, false);
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end() && !isEBDirichlet())
    {  // No Dirichlet
        for (int alev = 0; alev < m_num_amr_levels; ++alev)
        {
            if (m_domain_covered[alev])
            {
                if (m_a_scalar == 0.0)
                {
                    m_is_singular[alev] = true;
                }
                else
                {
                    Real asum = m_a_coeffs[alev].back().sum();
                    Real amax = m_a_coeffs[alev].back().norm0();
                    m_is_singular[alev] = (asum <= amax * 1.e-12);
                }
            }
        }
    }

    m_needs_update = false;
}